

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::Clipper::IsContributing(Clipper *this,TEdge *edge)

{
  ClipType CVar1;
  long64 lVar2;
  PolyFillType local_28;
  PolyFillType local_24;
  PolyFillType pft2;
  PolyFillType pft;
  TEdge *edge_local;
  Clipper *this_local;
  
  if (edge->polyType == ptSubject) {
    local_24 = this->m_SubjFillType;
    local_28 = this->m_ClipFillType;
  }
  else {
    local_24 = this->m_ClipFillType;
    local_28 = this->m_SubjFillType;
  }
  if (local_24 < pftPositive) {
    lVar2 = Abs((long)edge->windCnt);
    if (lVar2 != 1) {
      return false;
    }
  }
  else if (local_24 == pftPositive) {
    if (edge->windCnt != 1) {
      return false;
    }
  }
  else if (edge->windCnt != -1) {
    return false;
  }
  CVar1 = this->m_ClipType;
  if (CVar1 == ctIntersection) {
    if (local_28 < pftPositive) {
      this_local._7_1_ = edge->windCnt2 != 0;
    }
    else if (local_28 == pftPositive) {
      this_local._7_1_ = 0 < edge->windCnt2;
    }
    else {
      this_local._7_1_ = edge->windCnt2 < 0;
    }
  }
  else if (CVar1 == ctUnion) {
    if (local_28 < pftPositive) {
      this_local._7_1_ = edge->windCnt2 == 0;
    }
    else if (local_28 == pftPositive) {
      this_local._7_1_ = edge->windCnt2 < 1;
    }
    else {
      this_local._7_1_ = -1 < edge->windCnt2;
    }
  }
  else if (CVar1 == ctDifference) {
    if (edge->polyType == ptSubject) {
      if (local_28 < pftPositive) {
        this_local._7_1_ = edge->windCnt2 == 0;
      }
      else if (local_28 == pftPositive) {
        this_local._7_1_ = edge->windCnt2 < 1;
      }
      else {
        this_local._7_1_ = -1 < edge->windCnt2;
      }
    }
    else if (local_28 < pftPositive) {
      this_local._7_1_ = edge->windCnt2 != 0;
    }
    else if (local_28 == pftPositive) {
      this_local._7_1_ = 0 < edge->windCnt2;
    }
    else {
      this_local._7_1_ = edge->windCnt2 < 0;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Clipper::IsContributing(const TEdge& edge) const
{
  PolyFillType pft, pft2;
  if (edge.polyType == ptSubject)
  {
    pft = m_SubjFillType;
    pft2 = m_ClipFillType;
  } else
  {
    pft = m_ClipFillType;
    pft2 = m_SubjFillType;
  }

  switch(pft)
  {
    case pftEvenOdd: 
    case pftNonZero:
      if (Abs(edge.windCnt) != 1) return false;
      break;
    case pftPositive: 
      if (edge.windCnt != 1) return false;
      break;
    default: //pftNegative
      if (edge.windCnt != -1) return false;
  }

  switch(m_ClipType)
  {
    case ctIntersection:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.windCnt2 != 0);
        case pftPositive: 
          return (edge.windCnt2 > 0);
        default: 
          return (edge.windCnt2 < 0);
      }
    case ctUnion:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.windCnt2 == 0);
        case pftPositive: 
          return (edge.windCnt2 <= 0);
        default: 
          return (edge.windCnt2 >= 0);
      }
    case ctDifference:
      if (edge.polyType == ptSubject)
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.windCnt2 == 0);
          case pftPositive: 
            return (edge.windCnt2 <= 0);
          default: 
            return (edge.windCnt2 >= 0);
        }
      else
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.windCnt2 != 0);
          case pftPositive: 
            return (edge.windCnt2 > 0);
          default: 
            return (edge.windCnt2 < 0);
        }
    default:
      return true;
  }
}